

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O0

void ktxTexture_rowInfo(ktxTexture *This,ktx_uint32_t level,ktx_uint32_t *numRows,
                       ktx_uint32_t *pRowLengthBytes,ktx_uint32_t *pRowPadding)

{
  long lVar1;
  ktx_uint32_t kVar2;
  uint *in_RCX;
  uint *in_RDX;
  byte in_SIL;
  long in_RDI;
  ktx_uint32_t *in_R8;
  blockCount blockCount;
  ktxTexture_protected *prtctd;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  uint local_38;
  
  lVar1 = *(long *)(in_RDI + 0x18);
  if (in_RDI == 0) {
    __assert_fail("This != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                  ,0x32f,
                  "void ktxTexture_rowInfo(ktxTexture *, ktx_uint32_t, ktx_uint32_t *, ktx_uint32_t *, ktx_uint32_t *)"
                 );
  }
  if ((*(byte *)(in_RDI + 0x22) & 1) == 0) {
    if (((*(int *)(lVar1 + 0x24) == 1) && (*(int *)(lVar1 + 0x28) == 1)) &&
       (*(int *)(lVar1 + 0x2c) == 1)) {
      if (*(uint *)(in_RDI + 0x24) / *(uint *)(lVar1 + 0x24) >> (in_SIL & 0x1f) == 0) {
        local_38 = 1;
      }
      else {
        local_38 = *(uint *)(in_RDI + 0x24) / *(uint *)(lVar1 + 0x24) >> (in_SIL & 0x1f);
      }
      if (*(uint *)(in_RDI + 0x28) / *(uint *)(lVar1 + 0x28) >> (in_SIL & 0x1f) == 0) {
        uVar3 = 1;
      }
      else {
        uVar3 = *(uint *)(in_RDI + 0x28) / *(uint *)(lVar1 + 0x28) >> (in_SIL & 0x1f);
      }
      *in_RDX = uVar3;
      *in_RCX = local_38 * *(int *)(lVar1 + 0x20) >> 3;
      kVar2 = padRow((ktx_uint32_t *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
      *in_R8 = kVar2;
      return;
    }
    __assert_fail("prtctd->_formatSize.blockWidth == 1U && prtctd->_formatSize.blockHeight == 1U && prtctd->_formatSize.blockDepth == 1U"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                  ,0x334,
                  "void ktxTexture_rowInfo(ktxTexture *, ktx_uint32_t, ktx_uint32_t *, ktx_uint32_t *, ktx_uint32_t *)"
                 );
  }
  __assert_fail("!This->isCompressed",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                ,0x331,
                "void ktxTexture_rowInfo(ktxTexture *, ktx_uint32_t, ktx_uint32_t *, ktx_uint32_t *, ktx_uint32_t *)"
               );
}

Assistant:

void
ktxTexture_rowInfo(ktxTexture* This, ktx_uint32_t level,
                   ktx_uint32_t* numRows, ktx_uint32_t* pRowLengthBytes,
                   ktx_uint32_t* pRowPadding)
{
    DECLARE_PROTECTED(ktxTexture);
    struct blockCount {
        ktx_uint32_t x;
    } blockCount;

    assert (This != NULL);

    assert(!This->isCompressed);
    assert(prtctd->_formatSize.blockWidth == 1U
           && prtctd->_formatSize.blockHeight == 1U
           && prtctd->_formatSize.blockDepth == 1U);

    blockCount.x = MAX(1, (This->baseWidth / prtctd->_formatSize.blockWidth)  >> level);
    *numRows = MAX(1, (This->baseHeight / prtctd->_formatSize.blockHeight)  >> level);

    *pRowLengthBytes = blockCount.x * prtctd->_formatSize.blockSizeInBits / 8;
    *pRowPadding = padRow(pRowLengthBytes);
}